

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O3

int duckdb_lz4::LZ4_compress_generic
              (LZ4_stream_t_internal *cctx,char *src,char *dst,int srcSize,int *inputConsumed,
              int dstCapacity,limitedOutput_directive outputDirective,tableType_t tableType,
              dict_directive dictDirective,dictIssue_directive dictIssue,int acceleration)

{
  uint uVar1;
  uint uVar2;
  LZ4_stream_t_internal *pLVar3;
  int *piVar4;
  char cVar5;
  int iVar6;
  BYTE *s;
  LZ4_stream_t_internal *pLVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  char cVar12;
  int iVar13;
  uint uVar14;
  long *pInLimit;
  long lVar15;
  long *plVar16;
  char *__n;
  ushort uVar17;
  int *piVar18;
  long *plVar19;
  int iVar20;
  uint uVar21;
  char *__s;
  long lVar22;
  char *pcVar23;
  long lVar24;
  long *__src;
  ulong uVar25;
  int *piVar26;
  U16 *hashTable;
  uint uVar27;
  BYTE *e;
  long *plVar28;
  long *plVar29;
  bool bVar30;
  bool bVar31;
  long *local_f0;
  int local_e4;
  int local_e0;
  long local_a0;
  int local_88;
  U32 *hashTable_4;
  
  iVar13 = 0;
  if ((uint)srcSize < 0x7e000001) {
    if (srcSize == 0) {
      iVar13 = 0;
      if (0 < dstCapacity || outputDirective == notLimited) {
        *dst = '\0';
        iVar13 = 1;
        if (outputDirective == fillOutput) {
          *inputConsumed = 0;
        }
      }
    }
    else {
      uVar1 = cctx->currentOffset;
      pLVar3 = cctx->dictCtx;
      pLVar7 = cctx;
      if (dictDirective == usingDictCtx) {
        pLVar7 = pLVar3;
      }
      piVar4 = (int *)pLVar7->dictionary;
      uVar2 = pLVar7->dictSize;
      if (dictDirective != usingDictCtx) {
        bVar30 = dictDirective == usingExtDict;
        bVar31 = (dictDirective & ~withPrefix64k) == usingExtDict;
        lVar22 = (long)piVar4 + (ulong)uVar2;
        local_a0 = lVar22 - (ulong)uVar1;
        if (piVar4 == (int *)0x0) {
          local_a0 = 0;
          lVar22 = 0;
        }
        iVar20 = 0;
      }
      else {
        iVar20 = uVar1 - pLVar3->currentOffset;
        bVar31 = true;
        if (piVar4 == (int *)0x0) {
          lVar22 = 0;
          bVar30 = false;
          local_a0 = 0;
        }
        else {
          lVar22 = (long)piVar4 + (ulong)uVar2;
          local_a0 = lVar22 - (ulong)pLVar3->currentOffset;
          bVar30 = false;
        }
      }
      iVar13 = 0;
      if ((0 < dstCapacity || outputDirective != fillOutput) &&
         ((uint)srcSize < 0x1000b || tableType != byU16)) {
        uVar25 = 0;
        if (dictDirective == withPrefix64k) {
          uVar25 = (ulong)uVar2;
        }
        if (dictDirective == usingDictCtx) {
          cctx->dictCtx = (LZ4_stream_t_internal *)0x0;
          cctx->dictSize = srcSize;
        }
        else {
          cctx->dictSize = cctx->dictSize + srcSize;
        }
        pcVar11 = dst + dstCapacity;
        cctx->currentOffset = uVar1 + srcSize;
        cctx->tableType = tableType;
        pcVar23 = dst;
        __src = (long *)src;
        if (0xc < (uint)srcSize) {
          if (tableType == byU16) {
            *(short *)((long)cctx->hashTable +
                      (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = (short)uVar1;
            uVar9 = (ulong)((uint)(*(int *)(src + 1) * -0x61c8864f) >> 0x13);
          }
          else {
            cctx->hashTable[(ulong)(*(long *)src * -0x30e4432345000000) >> 0x34] = uVar1;
            uVar9 = (ulong)(*(long *)(src + 1) * -0x30e4432345000000) >> 0x34;
          }
          plVar16 = (long *)(src + 1);
          lVar24 = (long)src - (ulong)uVar1;
          pInLimit = (long *)(src + ((ulong)(uint)srcSize - 5));
          piVar26 = (int *)(src + -uVar25);
          local_e4 = 0;
          local_f0 = (long *)src;
LAB_00237f21:
          iVar6 = 1;
          iVar13 = acceleration << 6;
          do {
            if (tableType == byU32) {
              uVar21 = cctx->hashTable[uVar9];
            }
            else {
              uVar21 = (uint)*(ushort *)((long)cctx->hashTable + uVar9 * 2);
            }
            plVar19 = (long *)((long)iVar6 + (long)plVar16);
            __src = local_f0;
            if (src + ((ulong)(uint)srcSize - 0xb) < plVar19) break;
            uVar25 = (ulong)uVar21;
            if (dictDirective == usingDictCtx) {
              if (uVar21 < uVar1) {
                uVar25 = (ulong)pLVar3->hashTable[uVar9];
                uVar21 = pLVar3->hashTable[uVar9] + iVar20;
LAB_00237f8f:
                piVar8 = (int *)(uVar25 + local_a0);
                piVar26 = piVar4;
              }
              else {
LAB_00237f9e:
                piVar8 = (int *)(uVar25 + lVar24);
                piVar26 = (int *)src;
              }
            }
            else {
              if (bVar30) {
                if (uVar1 <= uVar21) goto LAB_00237f9e;
                goto LAB_00237f8f;
              }
              piVar8 = (int *)(uVar25 + lVar24);
            }
            uVar14 = (uint)((long)plVar16 - lVar24);
            if (tableType == byU16) {
              uVar25 = (ulong)((uint)((int)*plVar19 * -0x61c8864f) >> 0x13);
              *(short *)((long)cctx->hashTable + uVar9 * 2) = (short)((long)plVar16 - lVar24);
            }
            else {
              uVar25 = (ulong)(*plVar19 * -0x30e4432345000000) >> 0x34;
              cctx->hashTable[uVar9] = uVar14;
            }
            if ((((dictIssue != dictSmall) || (uVar1 - uVar2 <= uVar21)) &&
                ((tableType == byU16 || (uVar14 <= uVar21 + 0xffff)))) && (*piVar8 == (int)*plVar16)
               ) goto LAB_0023801e;
            iVar6 = iVar13 >> 6;
            iVar13 = iVar13 + 1;
            uVar9 = uVar25;
            plVar16 = plVar19;
          } while( true );
        }
LAB_002386c1:
        __n = src + ((ulong)(uint)srcSize - (long)__src);
        if (outputDirective != notLimited) {
LAB_002386d1:
          if (pcVar11 < pcVar23 + (long)(__n + (ulong)(__n + 0xf0) / 0xff + 1)) {
            if (outputDirective != fillOutput) {
              return 0;
            }
            __n = pcVar11 + (~(ulong)pcVar23 - ((ulong)(pcVar11 + ~(ulong)pcVar23 + 0xf1) >> 8));
          }
        }
        if (__n < (char *)0xf) {
          *pcVar23 = (char)__n << 4;
        }
        else {
          pcVar11 = __n + -0xf;
          *pcVar23 = -0x10;
          __s = pcVar23 + 1;
          if ((char *)0xfe < pcVar11) {
            uVar25 = (ulong)(__n + -0x10e) / 0xff;
            memset(__s,0xff,uVar25 + 1);
            pcVar11 = __n + uVar25 * -0xff + -0x10e;
            __s = pcVar23 + uVar25 + 2;
          }
          *__s = (char)pcVar11;
          pcVar23 = __s;
        }
        switchD_00332694::default(pcVar23 + 1,__src,(size_t)__n);
        if (outputDirective == fillOutput) {
          local_e0 = (int)src;
          *inputConsumed = ((int)__src + (int)__n) - local_e0;
        }
        local_88 = (int)dst;
        iVar13 = ((int)pcVar23 + (int)__n + 1) - local_88;
      }
    }
  }
  return iVar13;
LAB_0023801e:
  if (bVar31) {
    local_e4 = uVar14 - uVar21;
  }
  uVar14 = (int)plVar16 - (int)local_f0;
  lVar10 = 0;
  cVar5 = (char)plVar16 * '\x10' + (char)local_f0 * -0x10;
  uVar21 = uVar14 - 0xf;
  do {
    uVar27 = uVar21;
    cVar12 = cVar5;
    lVar15 = lVar10;
    piVar18 = (int *)((long)piVar8 + lVar15);
    __src = (long *)((long)plVar16 + lVar15);
    if ((piVar18 <= piVar26) || (__src <= local_f0)) break;
    lVar10 = lVar15 + -1;
    cVar5 = cVar12 + -0x10;
    uVar21 = uVar27 - 1;
  } while (*(char *)((long)plVar16 + lVar15 + -1) == *(char *)((long)piVar8 + lVar15 + -1));
  uVar25 = (long)__src - (long)local_f0;
  plVar19 = (long *)(pcVar23 + 1);
  iVar13 = (int)lVar15;
  plVar29 = local_f0;
  if (outputDirective == limitedOutput) {
    if (pcVar11 < (char *)((long)plVar19 +
                          ((ulong)uVar14 + lVar15 & 0xffffffff) / 0xff + (uVar25 & 0xffffffff) + 8))
    {
      return 0;
    }
  }
  else if ((outputDirective == fillOutput) &&
          (pcVar11 < (char *)((long)plVar19 +
                             (uVar25 & 0xffffffff) + (ulong)(uVar14 + iVar13 + 0xf0) / 0xff + 0xb)))
  goto LAB_002386a2;
  if ((uint)((ulong)uVar14 + lVar15) < 0xf) {
    *pcVar23 = cVar12;
  }
  else {
    uVar9 = (ulong)(uVar14 - 0xf) + lVar15;
    *pcVar23 = -0x10;
    if (0xfe < (int)uVar9) {
      uVar21 = 0x1fd;
      if (uVar27 < 0x1fd) {
        uVar21 = uVar27;
      }
      if (0x1fc < (int)uVar27) {
        uVar27 = 0x1fd;
      }
      memset(plVar19,0xff,(ulong)((((uVar14 + 0xef) - uVar21) + iVar13) / 0xff + 1));
      uVar9 = (ulong)(((uVar14 + 0xef) - uVar27) + iVar13) / 0xff;
      plVar19 = (long *)(pcVar23 + uVar9 + 2);
      uVar9 = (ulong)((uVar14 - 0x10e) + iVar13 + (int)uVar9 * -0xff);
    }
    *(char *)plVar19 = (char)uVar9;
    plVar19 = (long *)((long)plVar19 + 1);
  }
  plVar28 = (long *)((uVar25 & 0xffffffff) + (long)plVar19);
  do {
    *plVar19 = *local_f0;
    plVar19 = plVar19 + 1;
    local_f0 = local_f0 + 1;
  } while (plVar19 < plVar28);
  if ((outputDirective != fillOutput) || ((char *)((long)plVar28 + 0xb) <= pcVar11)) {
LAB_0023823d:
    if (bVar31) {
      *(short *)plVar28 = (short)local_e4;
      if (piVar26 != piVar4) goto LAB_0023828f;
      plVar19 = (long *)((lVar22 - (long)piVar18) + (long)__src);
      if (pInLimit < plVar19) {
        plVar19 = pInLimit;
      }
      uVar21 = LZ4_count((BYTE *)((long)__src + 4),(BYTE *)(piVar18 + 1),(BYTE *)plVar19);
      __src = (long *)((long)__src + (ulong)uVar21 + 4);
      if (__src == plVar19) {
        uVar14 = LZ4_count((BYTE *)plVar19,(BYTE *)src,(BYTE *)pInLimit);
        uVar21 = uVar21 + uVar14;
        __src = (long *)((long)__src + (ulong)uVar14);
      }
    }
    else {
      *(short *)plVar28 = (short)__src - (short)piVar18;
LAB_0023828f:
      uVar21 = LZ4_count((BYTE *)((long)__src + 4),(BYTE *)(piVar18 + 1),(BYTE *)pInLimit);
      __src = (long *)((long)__src + (ulong)uVar21 + 4);
    }
    local_f0 = (long *)((long)plVar28 + 2);
    if ((outputDirective != notLimited) &&
       (pcVar11 < (char *)((long)plVar28 + (ulong)(uVar21 + 0xf0) / 0xff + 8))) {
      if (outputDirective != fillOutput) {
        return 0;
      }
      uVar14 = ((int)pcVar11 - (int)local_f0) * 0xff - 0x5ec;
      __src = (long *)((long)__src - (ulong)(uVar21 - uVar14));
      for (plVar19 = __src; uVar21 = uVar14, plVar19 <= plVar16;
          plVar19 = (long *)((long)plVar19 + 1)) {
        if (tableType == byU16) {
          *(undefined2 *)
           ((long)cctx->hashTable + (ulong)((uint)((int)*plVar19 * -0x61c8864f) >> 0x13) * 2) = 0;
        }
        else {
          cctx->hashTable[(ulong)(*plVar19 * -0x30e4432345000000) >> 0x34] = 0;
        }
      }
    }
    if (uVar21 < 0xf) {
      *pcVar23 = *pcVar23 + (char)uVar21;
    }
    else {
      *pcVar23 = *pcVar23 + '\x0f';
      uVar17 = (ushort)(uVar21 - 0xf);
      *(undefined4 *)local_f0 = 0xffffffff;
      if (0x3fb < uVar21 - 0xf) {
        uVar17 = (ushort)((ulong)(uVar21 - 0x40b) % 0x3fc);
        uVar25 = (ulong)((uVar21 - 0x40b) / 0x3fc << 2);
        memset((char *)((long)plVar28 + 6),0xff,uVar25 + 4);
        local_f0 = (long *)((long)local_f0 + uVar25 + 4);
      }
      pcVar23 = (char *)((long)local_f0 + (ulong)(uVar17 / 0xff));
      local_f0 = (long *)(pcVar23 + 1);
      *pcVar23 = (char)(uVar17 % 0xff);
    }
    pcVar23 = (char *)local_f0;
    if (src + ((ulong)(uint)srcSize - 0xb) <= __src) goto LAB_002386c1;
    lVar10 = (long)__src + (-2 - lVar24);
    if (tableType == byU16) {
      *(short *)((long)cctx->hashTable +
                (ulong)((uint)(*(int *)((long)__src + -2) * -0x61c8864f) >> 0x13) * 2) =
           (short)lVar10;
      uVar25 = (ulong)((uint)((int)*__src * -0x61c8864f) >> 0x13);
      uVar21 = (int)__src - (int)lVar24;
LAB_00238431:
      uVar9 = (ulong)*(ushort *)((long)cctx->hashTable + uVar25 * 2);
    }
    else {
      cctx->hashTable[(ulong)(*(long *)((long)__src + -2) * -0x30e4432345000000) >> 0x34] =
           (LZ4_u32)lVar10;
      uVar25 = (ulong)(*__src * -0x30e4432345000000) >> 0x34;
      uVar21 = (int)__src - (int)lVar24;
      if (tableType != byU32) goto LAB_00238431;
      uVar9 = (ulong)cctx->hashTable[uVar25];
    }
    uVar14 = (uint)uVar9;
    if (dictDirective == usingDictCtx) {
      if (uVar14 < uVar1) {
        uVar9 = (ulong)pLVar3->hashTable[uVar25];
        uVar14 = iVar20 + pLVar3->hashTable[uVar25];
LAB_00238469:
        piVar18 = (int *)(uVar9 + local_a0);
        piVar26 = piVar4;
      }
      else {
LAB_00238475:
        piVar18 = (int *)(uVar9 + lVar24);
        piVar26 = (int *)src;
      }
    }
    else {
      if (bVar30) {
        if (uVar1 <= uVar14) goto LAB_00238475;
        goto LAB_00238469;
      }
      piVar18 = (int *)(uVar9 + lVar24);
    }
    if (tableType == byU16) {
      *(short *)((long)cctx->hashTable + uVar25 * 2) = (short)uVar21;
    }
    else {
      cctx->hashTable[uVar25] = uVar21;
    }
    if ((dictIssue != dictSmall) || (uVar1 - uVar2 <= uVar14)) {
      if ((tableType != byU16) && (uVar14 + 0xffff < uVar21)) goto LAB_00238669;
      if (*piVar18 != (int)*__src) goto LAB_00238630;
      plVar28 = (long *)((long)local_f0 + 1);
      if (bVar31) {
        local_e4 = uVar21 - uVar14;
      }
      *(char *)local_f0 = '\0';
      if ((outputDirective == fillOutput) &&
         (plVar29 = __src, pcVar11 < (char *)((long)local_f0 + 0xc))) goto LAB_002386a2;
      goto LAB_0023823d;
    }
LAB_00238630:
    plVar16 = (long *)((long)__src + 1);
    if (tableType == byU16) {
      uVar9 = (ulong)((uint)(*(int *)plVar16 * -0x61c8864f) >> 0x13);
      local_f0 = __src;
    }
    else {
LAB_00238669:
      plVar16 = (long *)((long)__src + 1);
      uVar9 = (ulong)(*plVar16 * -0x30e4432345000000) >> 0x34;
      local_f0 = __src;
    }
    goto LAB_00237f21;
  }
LAB_002386a2:
  __n = src + ((ulong)(uint)srcSize - (long)plVar29);
  __src = plVar29;
  goto LAB_002386d1;
}

Assistant:

LZ4_FORCE_INLINE int LZ4_compress_generic(
                 LZ4_stream_t_internal* const cctx,
                 const char* const src,
                 char* const dst,
                 const int srcSize,
                 int *inputConsumed, /* only written when outputDirective == fillOutput */
                 const int dstCapacity,
                 const limitedOutput_directive outputDirective,
                 const tableType_t tableType,
                 const dict_directive dictDirective,
                 const dictIssue_directive dictIssue,
                 const int acceleration)
{
    DEBUGLOG(5, "LZ4_compress_generic: srcSize=%i, dstCapacity=%i",
                srcSize, dstCapacity);

    if ((U32)srcSize > (U32)LZ4_MAX_INPUT_SIZE) { return 0; }  /* Unsupported srcSize, too large (or negative) */
    if (srcSize == 0) {   /* src == NULL supported if srcSize == 0 */
        if (outputDirective != notLimited && dstCapacity <= 0) return 0;  /* no output, can't write anything */
        DEBUGLOG(5, "Generating an empty block");
        assert(outputDirective == notLimited || dstCapacity >= 1);
        assert(dst != NULL);
        dst[0] = 0;
        if (outputDirective == fillOutput) {
            assert (inputConsumed != NULL);
            *inputConsumed = 0;
        }
        return 1;
    }
    assert(src != NULL);

    return LZ4_compress_generic_validated(cctx, src, dst, srcSize,
                inputConsumed, /* only written into if outputDirective == fillOutput */
                dstCapacity, outputDirective,
                tableType, dictDirective, dictIssue, acceleration);
}